

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::visitProFile(QMakeEvaluator *this,ProFile *pro,EvalFileType type,LoadFlags flags)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  Int IVar2;
  VisitReturn VVar3;
  QMakeEvaluator *pQVar4;
  QMakeEvaluator *pQVar5;
  ProFile *pPVar6;
  char *pcVar7;
  undefined4 in_EDX;
  QMakeEvaluator *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  VisitReturn vr;
  bool ok;
  QMakeEvaluator *baseEval;
  QMakeBaseEnv *baseEnv;
  QMakeBaseEnv **baseEnvPtr;
  ConstIterator it;
  undefined4 in_stack_fffffffffffffc28;
  LoadFlag in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  QMakeEvaluator *in_stack_fffffffffffffc38;
  QMakeHandler *pQVar12;
  QMakeBaseKey *in_stack_fffffffffffffc40;
  QString *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  VisitReturn in_stack_fffffffffffffc54;
  QMakeEvaluator *in_stack_fffffffffffffc58;
  QMakeParser *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  VisitReturn in_stack_fffffffffffffc6c;
  QMakeEvaluator *in_stack_fffffffffffffc70;
  QMakeEvaluator *in_stack_fffffffffffffca8;
  undefined1 silent;
  undefined7 in_stack_fffffffffffffcb0;
  byte in_stack_fffffffffffffcb7;
  VisitReturn local_338;
  QMakeEvaluator *in_stack_fffffffffffffce0;
  VisitReturn local_304;
  storage_type *local_270;
  undefined1 local_260 [64];
  storage_type *local_220;
  undefined1 local_210 [28];
  QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4> local_1f4;
  QString local_1f0 [2];
  QString local_1c0 [2];
  storage_type *local_190;
  undefined1 local_180 [64];
  const_iterator local_140;
  const_iterator local_138;
  storage_type *local_130;
  undefined1 local_120 [28];
  QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4> local_104;
  QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4> local_54;
  QMakeEvaluator *local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  local_50 = in_RSI;
  bVar1 = ProFile::isOk((ProFile *)in_RSI);
  if (!bVar1) {
    local_304 = ReturnFalse;
    goto LAB_002fc4da;
  }
  local_54.super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i =
       (QFlagsStorage<QMakeEvaluator::LoadFlag>)
       QFlags<QMakeEvaluator::LoadFlag>::operator&
                 ((QFlags<QMakeEvaluator::LoadFlag> *)
                  CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc2c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_54);
  if (IVar2 == 0) {
    if ((in_RDI->m_valuemapInited & 1U) == 0) {
      loadDefaults(pQVar4);
    }
  }
  else {
    ProFile::directoryName((ProFile *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28))
    ;
    bVar1 = prepareProject(in_stack_fffffffffffffc58,
                           (QString *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
    ;
    in_stack_fffffffffffffcb7 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x2fba3a);
    if ((in_stack_fffffffffffffcb7 & 1) != 0) {
      local_304 = ReturnFalse;
      goto LAB_002fc4da;
    }
    bVar1 = ProFile::isHostBuild((ProFile *)local_50);
    in_RDI->m_hostBuild = bVar1;
    QMakeBaseKey::QMakeBaseKey
              (in_stack_fffffffffffffc40,(QString *)in_stack_fffffffffffffc38,
               (QString *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               SUB41(in_stack_fffffffffffffc2c >> 0x18,0));
    in_stack_fffffffffffffca8 =
         (QMakeEvaluator *)
         QHash<QMakeBaseKey,_QMakeBaseEnv_*>::operator[]
                   ((QHash<QMakeBaseKey,_QMakeBaseEnv_*> *)in_stack_fffffffffffffc40,
                    (QMakeBaseKey *)in_stack_fffffffffffffc38);
    QMakeBaseKey::~QMakeBaseKey
              ((QMakeBaseKey *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    in_stack_fffffffffffffce0 = in_stack_fffffffffffffca8;
    if (in_stack_fffffffffffffca8->m_caller == (QMakeEvaluator *)0x0) {
      pQVar4 = (QMakeEvaluator *)operator_new(8);
      QMakeBaseEnv::QMakeBaseEnv((QMakeBaseEnv *)pQVar4);
      in_stack_fffffffffffffce0->m_caller = pQVar4;
    }
    pQVar4 = in_stack_fffffffffffffce0->m_caller;
    if (pQVar4->m_caller == (QMakeEvaluator *)0x0) {
      pQVar5 = (QMakeEvaluator *)operator_new(0x2b0);
      QMakeEvaluator(in_stack_fffffffffffffc70,
                     (QMakeGlobals *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                     in_stack_fffffffffffffc60,(QMakeVfs *)in_stack_fffffffffffffc58,
                     (QMakeHandler *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      pQVar4->m_caller = pQVar5;
      QString::operator=(&pQVar5->m_superfile,(QString *)&in_RDI->m_superfile);
      QString::operator=(&pQVar5->m_conffile,(QString *)&in_RDI->m_conffile);
      QString::operator=(&pQVar5->m_cachefile,(QString *)&in_RDI->m_cachefile);
      QString::operator=(&pQVar5->m_stashfile,(QString *)&in_RDI->m_stashfile);
      QString::operator=(&pQVar5->m_sourceRoot,(QString *)&in_RDI->m_sourceRoot);
      QString::operator=(&pQVar5->m_buildRoot,(QString *)&in_RDI->m_buildRoot);
      pQVar5->m_hostBuild = (bool)(in_RDI->m_hostBuild & 1);
      bVar1 = loadSpec(in_stack_fffffffffffffce0);
      if (!bVar1) {
        local_304 = ReturnFalse;
        goto LAB_002fc4da;
      }
    }
    initFrom((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (QMakeEvaluator *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  }
  pQVar12 = in_RDI->m_handler;
  pPVar6 = currentProFile((QMakeEvaluator *)
                          CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  (**(code **)(*(long *)pQVar12 + 0x10))(pQVar12,pPVar6,local_50,in_EDX);
  QStack<ProFile_*>::push
            ((QStack<ProFile_*> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (ProFile **)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  currentDirectory(in_stack_fffffffffffffc38);
  ProString::ProString
            ((ProString *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProStringList::ProStringList
            ((ProStringList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (ProString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  valuesRef(in_stack_fffffffffffffc58,
            (ProKey *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  ProStringList::operator=
            ((ProStringList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (ProStringList *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProKey::~ProKey((ProKey *)0x2fbdde);
  ProStringList::~ProStringList((ProStringList *)0x2fbdeb);
  ProString::~ProString((ProString *)0x2fbdf8);
  QString::~QString((QString *)0x2fbe05);
  local_104.super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i =
       (QFlagsStorage<QMakeEvaluator::LoadFlag>)
       QFlags<QMakeEvaluator::LoadFlag>::operator&
                 ((QFlags<QMakeEvaluator::LoadFlag> *)
                  CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc2c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_104);
  silent = (undefined1)((ulong)in_stack_fffffffffffffca8 >> 0x38);
  if (IVar2 == 0) {
LAB_002fc0b9:
    if (in_RDI->m_debugLevel != 0) {
      ProFile::fileName((ProFile *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      QtPrivate::asString(local_1c0);
      QString::toLocal8Bit(in_stack_fffffffffffffc48);
      pcVar7 = QByteArray::constData((QByteArray *)0x2fc108);
      debugMsgInternal(in_RDI,1,"visiting file %s",pcVar7);
      QByteArray::~QByteArray((QByteArray *)0x2fc133);
      QString::~QString((QString *)0x2fc140);
    }
    ProFile::tokPtr((ProFile *)0x2fc15a);
    VVar3 = visitProBlock((QMakeEvaluator *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                          (ProFile *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                          (ushort *)0x2fc16f);
    in_stack_fffffffffffffc58 = local_50;
    if (VVar3 == ReturnError) {
      local_338 = ReturnError;
    }
    else {
      if (in_RDI->m_debugLevel != 0) {
        ProFile::fileName((ProFile *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        QtPrivate::asString(local_1f0);
        QString::toLocal8Bit(in_stack_fffffffffffffc48);
        pcVar7 = QByteArray::constData((QByteArray *)0x2fc1cf);
        debugMsgInternal(in_RDI,1,"done visiting file %s",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x2fc1fa);
        QString::~QString((QString *)0x2fc207);
        in_stack_fffffffffffffc58 = local_50;
      }
      local_1f4.super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i =
           (QFlagsStorage<QMakeEvaluator::LoadFlag>)
           QFlags<QMakeEvaluator::LoadFlag>::operator&
                     ((QFlags<QMakeEvaluator::LoadFlag> *)
                      CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                      in_stack_fffffffffffffc2c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1f4);
      if (IVar2 == 0) {
LAB_002fc3dd:
        local_338 = ReturnTrue;
      }
      else {
        QByteArrayView::QByteArrayView<22ul>
                  ((QByteArrayView *)in_stack_fffffffffffffc40,
                   (char (*) [22])in_stack_fffffffffffffc38);
        QVar10.m_data = local_220;
        QVar10.m_size = (qsizetype)local_210;
        QString::fromLatin1(QVar10);
        evaluateCommand((QMakeEvaluator *)
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                        (QString *)in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
        QString::~QString((QString *)0x2fc2ac);
        applyExtraConfigs((QMakeEvaluator *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        QLatin1String::QLatin1String
                  ((QLatin1String *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
        latin1_00.m_data._0_4_ = in_stack_fffffffffffffc68;
        latin1_00.m_size = (qsizetype)in_stack_fffffffffffffc60;
        latin1_00.m_data._4_4_ = in_stack_fffffffffffffc6c;
        QString::QString(&in_stack_fffffffffffffc40->root,latin1_00);
        local_338 = evaluateFeatureFile(in_RDI,(QString *)
                                               CONCAT17(in_stack_fffffffffffffcb7,
                                                        in_stack_fffffffffffffcb0),(bool)silent);
        in_stack_fffffffffffffc54 = local_338;
        QString::~QString((QString *)0x2fc319);
        if (in_stack_fffffffffffffc54 != ReturnError) {
          bVar1 = QString::isEmpty((QString *)0x2fc346);
          if (!bVar1) {
            QByteArrayView::QByteArrayView<21ul>
                      ((QByteArrayView *)(in_RDI->m_option->extra_cmds + 3),
                       (char (*) [21])in_stack_fffffffffffffc38);
            QVar11.m_data = local_270;
            QVar11.m_size = (qsizetype)local_260;
            QString::fromLatin1(QVar11);
            evaluateCommand((QMakeEvaluator *)
                            CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                            (QString *)in_stack_fffffffffffffc60,
                            (QString *)in_stack_fffffffffffffc58);
            QString::~QString((QString *)0x2fc3c0);
          }
          VVar3 = evaluateConfigFeatures
                            ((QMakeEvaluator *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          if (VVar3 != ReturnError) goto LAB_002fc3dd;
          local_338 = ReturnError;
        }
      }
    }
  }
  else {
    setupProject(in_stack_fffffffffffffce0);
    bVar1 = QString::isEmpty((QString *)0x2fbe5c);
    if (!bVar1) {
      QByteArrayView::QByteArrayView<22ul>
                ((QByteArrayView *)in_stack_fffffffffffffc40,
                 (char (*) [22])in_stack_fffffffffffffc38);
      QVar8.m_data = local_130;
      QVar8.m_size = (qsizetype)local_120;
      QString::fromLatin1(QVar8);
      evaluateCommand((QMakeEvaluator *)
                      CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                      (QString *)in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
      QString::~QString((QString *)0x2fbed2);
    }
    local_138._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_138._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::constBegin
                   ((QMap<ProKey,_ProStringList> *)
                    CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    while( true ) {
      local_140._M_node =
           (_Base_ptr)
           QMap<ProKey,_ProStringList>::constEnd
                     ((QMap<ProKey,_ProStringList> *)
                      CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      bVar1 = ::operator!=((const_iterator *)
                           CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      silent = (undefined1)((ulong)in_stack_fffffffffffffca8 >> 0x38);
      if (!bVar1) break;
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::front((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
              CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      QMap<ProKey,_ProStringList>::const_iterator::key((const_iterator *)0x2fbf54);
      QMap<ProKey,_ProStringList>::const_iterator::value((const_iterator *)0x2fbf66);
      QMap<ProKey,_ProStringList>::insert
                ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffc40,
                 (ProKey *)in_stack_fffffffffffffc38,
                 (ProStringList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      QMap<ProKey,_ProStringList>::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    }
    applyExtraConfigs((QMakeEvaluator *)
                      CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    latin1.m_data._0_4_ = in_stack_fffffffffffffc68;
    latin1.m_size = (qsizetype)in_stack_fffffffffffffc60;
    latin1.m_data._4_4_ = in_stack_fffffffffffffc6c;
    QString::QString(&in_stack_fffffffffffffc40->root,latin1);
    local_338 = evaluateFeatureFile(in_RDI,(QString *)
                                           CONCAT17(in_stack_fffffffffffffcb7,
                                                    in_stack_fffffffffffffcb0),(bool)silent);
    in_stack_fffffffffffffc6c = local_338;
    QString::~QString((QString *)0x2fbfff);
    if (in_stack_fffffffffffffc6c != ReturnError) {
      bVar1 = QString::isEmpty((QString *)0x2fc02c);
      if (!bVar1) {
        in_stack_fffffffffffffc60 = (QMakeParser *)(in_RDI->m_option->extra_cmds + 1);
        QByteArrayView::QByteArrayView<15ul>
                  ((QByteArrayView *)in_stack_fffffffffffffc40,
                   (char (*) [15])in_stack_fffffffffffffc38);
        QVar9.m_data = local_190;
        QVar9.m_size = (qsizetype)local_180;
        QString::fromLatin1(QVar9);
        evaluateCommand((QMakeEvaluator *)
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                        (QString *)in_stack_fffffffffffffc60,(QString *)in_stack_fffffffffffffc58);
        QString::~QString((QString *)0x2fc0aa);
        applyExtraConfigs((QMakeEvaluator *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      }
      goto LAB_002fc0b9;
    }
  }
  QStack<ProFile_*>::pop((QStack<ProFile_*> *)0x2fc3f9);
  currentDirectory(in_stack_fffffffffffffc38);
  ProString::ProString
            ((ProString *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (QString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProStringList::ProStringList
            ((ProStringList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (ProString *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  valuesRef(in_stack_fffffffffffffc58,
            (ProKey *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  ProStringList::operator=
            ((ProStringList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (ProStringList *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  ProKey::~ProKey((ProKey *)0x2fc47e);
  ProStringList::~ProStringList((ProStringList *)0x2fc48b);
  ProString::~ProString((ProString *)0x2fc498);
  QString::~QString((QString *)0x2fc4a5);
  pQVar12 = in_RDI->m_handler;
  pPVar6 = currentProFile((QMakeEvaluator *)
                          CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  (**(code **)(*(long *)pQVar12 + 0x18))(pQVar12,pPVar6);
  local_304 = local_338;
LAB_002fc4da:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_304;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProFile(
        ProFile *pro, QMakeHandler::EvalFileType type, LoadFlags flags)
{
    if (!m_cumulative && !pro->isOk())
        return ReturnFalse;

    if (flags & LoadPreFiles) {
        if (!prepareProject(pro->directoryName()))
            return ReturnFalse;

        m_hostBuild = pro->isHostBuild();

#ifdef PROEVALUATOR_THREAD_SAFE
        m_option->mutex.lock();
#endif
        QMakeBaseEnv **baseEnvPtr = &m_option->baseEnvs[QMakeBaseKey(m_buildRoot, m_stashfile, m_hostBuild)];
        if (!*baseEnvPtr)
            *baseEnvPtr = new QMakeBaseEnv;
        QMakeBaseEnv *baseEnv = *baseEnvPtr;

#ifdef PROEVALUATOR_THREAD_SAFE
        QMutexLocker locker(&baseEnv->mutex);
        m_option->mutex.unlock();
        if (baseEnv->inProgress) {
            QThreadPool::globalInstance()->releaseThread();
            baseEnv->cond.wait(&baseEnv->mutex);
            QThreadPool::globalInstance()->reserveThread();
            if (!baseEnv->isOk)
                return ReturnFalse;
        } else
#endif
        if (!baseEnv->evaluator) {
#ifdef PROEVALUATOR_THREAD_SAFE
            baseEnv->inProgress = true;
            locker.unlock();
#endif

            QMakeEvaluator *baseEval = new QMakeEvaluator(m_option, m_parser, m_vfs, m_handler);
            baseEnv->evaluator = baseEval;
            baseEval->m_superfile = m_superfile;
            baseEval->m_conffile = m_conffile;
            baseEval->m_cachefile = m_cachefile;
            baseEval->m_stashfile = m_stashfile;
            baseEval->m_sourceRoot = m_sourceRoot;
            baseEval->m_buildRoot = m_buildRoot;
            baseEval->m_hostBuild = m_hostBuild;
            bool ok = baseEval->loadSpec();

#ifdef PROEVALUATOR_THREAD_SAFE
            locker.relock();
            baseEnv->isOk = ok;
            baseEnv->inProgress = false;
            baseEnv->cond.wakeAll();
#endif

            if (!ok)
                return ReturnFalse;
        }
#ifdef PROEVALUATOR_THREAD_SAFE
        else if (!baseEnv->isOk)
            return ReturnFalse;
#endif

        initFrom(baseEnv->evaluator);
    } else {
        if (!m_valuemapInited)
            loadDefaults();
    }

    VisitReturn vr;

    m_handler->aboutToEval(currentProFile(), pro, type);
    m_profileStack.push(pro);
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    if (flags & LoadPreFiles) {
        setupProject();

        if (!m_option->extra_cmds[QMakeEvalEarly].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalEarly], fL1S("(command line -early)"));

        for (ProValueMap::ConstIterator it = m_extraVars.constBegin();
             it != m_extraVars.constEnd(); ++it)
            m_valuemapStack.front().insert(it.key(), it.value());

        // In case default_pre needs to make decisions based on the current
        // build pass configuration.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_pre.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalBefore].isEmpty()) {
            evaluateCommand(m_option->extra_cmds[QMakeEvalBefore], fL1S("(command line)"));

            // Again, after user configs, to override them
            applyExtraConfigs();
        }
    }

    debugMsg(1, "visiting file %s", qPrintable(pro->fileName()));
    if ((vr = visitProBlock(pro, pro->tokPtr())) == ReturnError)
        goto failed;
    debugMsg(1, "done visiting file %s", qPrintable(pro->fileName()));

    if (flags & LoadPostFiles) {
        evaluateCommand(m_option->extra_cmds[QMakeEvalAfter], fL1S("(command line -after)"));

        // Again, to ensure the project does not mess with us.
        // Specifically, do not allow a project to override debug/release within a
        // debug_and_release build pass - it's too late for that at this point anyway.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_post.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalLate].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalLate], fL1S("(command line -late)"));

        if ((vr = evaluateConfigFeatures()) == ReturnError)
            goto failed;
    }
    vr = ReturnTrue;
  failed:
    m_profileStack.pop();
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    m_handler->doneWithEval(currentProFile());

    return vr;
}